

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Command * __thiscall
cmState::GetDependencyProviderCommand(Command *__return_storage_ptr__,cmState *this,Method method)

{
  bool bVar1;
  
  if ((this->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>._M_payload
      .super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
      super__Optional_payload_base<cmDependencyProvider>._M_engaged == true) {
    bVar1 = cmDependencyProvider::SupportsMethod
                      ((cmDependencyProvider *)&this->DependencyProvider,method);
    if (bVar1) {
      GetCommand(__return_storage_ptr__,this,(string *)&this->DependencyProvider);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

cmState::Command cmState::GetDependencyProviderCommand(
  cmDependencyProvider::Method method) const
{
  return (this->DependencyProvider &&
          this->DependencyProvider->SupportsMethod(method))
    ? this->GetCommand(this->DependencyProvider->GetCommand())
    : Command{};
}